

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O1

json __thiscall minja::Parser::parseNumber(Parser *this,CharIterator *it,CharIterator *end)

{
  byte bVar1;
  char *pcVar2;
  char *pcVar3;
  byte *pbVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  runtime_error *this_00;
  bool bVar9;
  undefined8 *in_RCX;
  byte *pbVar10;
  json_value jVar11;
  json_value extraout_RDX;
  json_value extraout_RDX_00;
  json_value extraout_RDX_01;
  char *pcVar12;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  bVar13;
  json jVar14;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [3];
  _Any_data local_b8;
  code *local_a8;
  undefined8 uStack_a0;
  
  pcVar2 = end->_M_current;
  pcVar3 = it[3]._M_current;
  pcVar12 = it[4]._M_current;
  while ((pcVar12 != pcVar3 && (iVar8 = isspace((int)*pcVar12), iVar8 != 0))) {
    pcVar12 = pcVar12 + 1;
    it[4]._M_current = pcVar12;
  }
  pbVar4 = (byte *)end->_M_current;
  if (((byte *)*in_RCX != pbVar4) && ((*pbVar4 == 0x2d || (*pbVar4 == 0x2b)))) {
    end->_M_current = (char *)(pbVar4 + 1);
  }
  pbVar10 = (byte *)end->_M_current;
  if (pbVar10 != (byte *)*in_RCX) {
    bVar7 = false;
    bVar9 = false;
    do {
      bVar1 = *pbVar10;
      bVar5 = bVar7;
      bVar6 = bVar9;
      if (9 < (int)(char)bVar1 - 0x30U) {
        if (bVar1 == 0x2e) {
          bVar5 = true;
          if (bVar7) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Multiple decimal points");
LAB_001e9508:
            __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          if ((pbVar10 == pbVar4) || ((bVar1 | 0x20) != 0x65)) break;
          bVar6 = true;
          if (bVar9) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this_00,"Multiple exponents");
            goto LAB_001e9508;
          }
        }
      }
      bVar9 = bVar6;
      bVar7 = bVar5;
      pbVar10 = pbVar10 + 1;
      end->_M_current = (char *)pbVar10;
    } while (pbVar10 != (byte *)*in_RCX);
  }
  if (pbVar10 == pbVar4) {
    end->_M_current = pcVar2;
    *(undefined1 *)
     &(this->template_str).
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = 0;
    (this->template_str).
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)this,true);
    nlohmann::json_abi_v3_11_3::
    basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::assert_invariant((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)this,true);
    jVar11 = extraout_RDX_01;
  }
  else {
    local_118[0]._M_dataplus._M_p = (pointer)&local_118[0].field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)local_118);
    local_a8 = (code *)0x0;
    uStack_a0 = 0;
    local_b8._M_unused._M_object = (void *)0x0;
    local_b8._8_8_ = 0;
    bVar13 = nlohmann::json_abi_v3_11_3::
             basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::parse<std::__cxx11::string&>
                       ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)this,local_118,(parser_callback_t *)&local_b8,true,false);
    jVar11 = bVar13.m_data.m_value;
    if (local_a8 != (code *)0x0) {
      (*local_a8)(&local_b8,&local_b8,__destroy_functor);
      jVar11 = extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118[0]._M_dataplus._M_p != &local_118[0].field_2) {
      operator_delete(local_118[0]._M_dataplus._M_p,local_118[0].field_2._M_allocated_capacity + 1);
      jVar11 = extraout_RDX_00;
    }
  }
  jVar14.m_data.m_value.object = jVar11.object;
  jVar14.m_data._0_8_ = this;
  return (json)jVar14.m_data;
}

Assistant:

json parseNumber(CharIterator& it, const CharIterator& end) {
        auto before = it;
        consumeSpaces();
        auto start = it;
        bool hasDecimal = false;
        bool hasExponent = false;

        if (it != end && (*it == '-' || *it == '+')) ++it;

        while (it != end) {
          if (std::isdigit(*it)) {
            ++it;
          } else if (*it == '.') {
            if (hasDecimal) throw std::runtime_error("Multiple decimal points");
            hasDecimal = true;
            ++it;
          } else if (it != start && (*it == 'e' || *it == 'E')) {
            if (hasExponent) throw std::runtime_error("Multiple exponents");
            hasExponent = true;
            ++it;
          } else {
            break;
          }
        }
        if (start == it) {
          it = before;
          return json(); // No valid characters found
        }

        std::string str(start, it);
        try {
          return json::parse(str);
        } catch (json::parse_error& e) {
          throw std::runtime_error("Failed to parse number: '" + str + "' (" + std::string(e.what()) + ")");
          return json();
        }
    }